

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

void __thiscall
std::__cxx11::string::string<soul::Identifier,void>
          (string *this,Identifier *__t,allocator<char> *__a)

{
  string *psVar1;
  pointer pcVar2;
  size_type sVar3;
  
  psVar1 = __t->name;
  if (psVar1 != (string *)0x0) {
    pcVar2 = (psVar1->_M_dataplus)._M_p;
    sVar3 = psVar1->_M_string_length;
    *(string **)this = this + 0x10;
    _M_construct<char_const*>(this,pcVar2,pcVar2 + sVar3);
    return;
  }
  soul::throwInternalCompilerError("isValid()","operator basic_string_view",0x22);
}

Assistant:

bool isValid() const noexcept                                   { return name != nullptr; }